

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

void __thiscall iutest::AssertionHelper::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  TestInfo *pTVar1;
  pointer pcVar2;
  int iVar3;
  ScopedTrace *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ScopedMessage *local_10;
  
  this_00 = ScopedTrace::GetInstance();
  local_10 = this;
  std::__cxx11::
  list<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
  ::remove(&this_00->list,(char *)&local_10);
  iVar3 = std::uncaught_exceptions();
  if ((((0 < iVar3) && (Test::Observer<void>::s_current != (Test *)0x0)) &&
      (Test::Observer<void>::s_current->m_test_info != (iuITestInfoMediator *)0x0)) &&
     (pTVar1 = Test::Observer<void>::s_current->m_test_info->m_test_info, pTVar1 != (TestInfo *)0x0)
     ) {
    std::vector<iutest::detail::iuCodeMessage,_std::allocator<iutest::detail::iuCodeMessage>_>::
    push_back(&pTVar1->m_uncaught_messages,&this->super_iuCodeMessage);
  }
  pcVar2 = (this->super_iuCodeMessage).m_message._M_dataplus._M_p;
  paVar4 = &(this->super_iuCodeMessage).m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~ScopedMessage()
        {
            ScopedTrace::GetInstance().list.remove(this);
            if( stl::uncaught_exception() )
            {
                detail::UncaughtScopedTrace::Add(*this);
            }
        }